

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::accumulateDerivativesDispatch1<false>
          (BeagleCPUImpl<double,_1,_0> *this,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  
  if (outSumDerivatives != (double *)0x0) {
    BeagleCPUImpl<double,1,0>::accumulateDerivativesDispatch2<false,true>
              ((BeagleCPUImpl<double,1,0> *)this,outDerivatives,outSumDerivatives,
               outSumSquaredDerivatives);
    return;
  }
  if (outSumSquaredDerivatives != (double *)0x0) {
    if ((long)this->kPatternCount < 1) {
      dVar4 = 0.0;
    }
    else {
      auVar3 = ZEXT816(0);
      lVar2 = 0;
      do {
        dVar4 = this->grandNumeratorDerivTmp[lVar2] / this->grandDenominatorDerivTmp[lVar2];
        auVar1._8_8_ = 0;
        auVar1._0_8_ = this->gPatternWeights[lVar2];
        auVar5._8_8_ = 0;
        auVar5._0_8_ = dVar4 * dVar4;
        auVar3 = vfmadd231sd_fma(auVar3,auVar5,auVar1);
        dVar4 = auVar3._0_8_;
        lVar2 = lVar2 + 1;
      } while (this->kPatternCount != lVar2);
    }
    *outSumSquaredDerivatives = dVar4;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE template <bool DoDerivatives>
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::accumulateDerivativesDispatch1(
        double* outDerivatives,
        double* outSumDerivatives,
        double* outSumSquaredDerivatives) {

    if (outSumDerivatives == NULL) {
        accumulateDerivativesDispatch2<DoDerivatives, false>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    } else {
        accumulateDerivativesDispatch2<DoDerivatives, true>(
                outDerivatives, outSumDerivatives, outSumSquaredDerivatives);
    }
}